

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::PathTypeHandlerBase::GetPropertyEquivalenceInfo
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  ushort uVar1;
  PropertyIndex PVar2;
  PropertyIndex PVar3;
  ushort uVar4;
  
  PVar2 = TypePath::LookupInline
                    ((this->typePath).ptr,propertyRecord->pid,
                     (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
  if (PVar2 == 0xffff) {
    PVar3 = 0xffff;
  }
  else {
    uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    uVar4 = -uVar1;
    if (PVar2 < uVar1) {
      uVar4 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
    }
    PVar3 = uVar4 + PVar2;
  }
  info->slotIndex = PVar3;
  info->isAuxSlot = (this->super_DynamicTypeHandler).inlineSlotCapacity <= PVar2;
  info->isWritable = PVar3 != 0xffff;
  return PVar3 != 0xffff;
}

Assistant:

bool PathTypeHandlerBase::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(propertyRecord->GetPropertyId(), GetPathLength());
        info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
        info.isAuxSlot = absSlotIndex >= this->inlineSlotCapacity;
        info.isWritable = info.slotIndex != Constants::NoSlot;
        return info.slotIndex != Constants::NoSlot;
    }